

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

float Js::InterpreterStackFrame::AsmJsInterpreter<float>(AsmJsCallStackLayout *layout)

{
  ArgSlot lhs;
  uint16 uVar1;
  ScriptFunction *function_00;
  FunctionBody *pFVar2;
  AsmJsFunctionInfo *this;
  float fVar3;
  void *unaff_retaddr;
  ArgumentReader local_88;
  undefined1 local_78 [8];
  AsmJsReturnStruct asmJsReturn;
  void *addressOfReturnAddress;
  void *returnAddress;
  ArgumentReader args;
  CallInfo callInfo;
  ArgSlot nbArgs;
  int flags;
  ScriptFunction *function;
  AsmJsCallStackLayout *layout_local;
  
  function_00 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(layout->functionObject);
  pFVar2 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
  this = FunctionBody::GetAsmJsFunctionInfo(pFVar2);
  lhs = AsmJsFunctionInfo::GetArgCount(this);
  uVar1 = UInt16Math::Add(lhs,1);
  CallInfo::CallInfo((CallInfo *)&args.super_Arguments.Values,CallFlags_Value,(uint)uVar1);
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&returnAddress,(CallInfo *)&args.super_Arguments.Values,
             &layout[1].functionObject);
  asmJsReturn.simd.field_0.f64[1] = (Type)register0x00000020;
  pFVar2 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function_00);
  FunctionBody::EnsureDynamicProfileInfo(pFVar2);
  memset(local_78,0,0x30);
  ArgumentReader::ArgumentReader(&local_88,(ArgumentReader *)&returnAddress);
  InterpreterHelper(function_00,&local_88,unaff_retaddr,(void *)asmJsReturn.simd.field_0.f64[1],
                    (AsmJsReturnStruct *)local_78);
  fVar3 = AsmJsReturnStruct::GetRetVal<float>((AsmJsReturnStruct *)local_78);
  return fVar3;
}

Assistant:

T InterpreterStackFrame::AsmJsInterpreter(AsmJsCallStackLayout* layout)
    {
        Js::ScriptFunction * function = Js::VarTo<Js::ScriptFunction>(layout->functionObject);
        int  flags = CallFlags_Value;
        ArgSlot nbArgs = ArgSlotMath::Add(function->GetFunctionBody()->GetAsmJsFunctionInfo()->GetArgCount(), 1);

        CallInfo callInfo((CallFlags)flags, nbArgs);
        ArgumentReader args(&callInfo, (Var*)layout->args);
        void* returnAddress = _ReturnAddress();
        void* addressOfReturnAddress = _AddressOfReturnAddress();
        function->GetFunctionBody()->EnsureDynamicProfileInfo();
        AsmJsReturnStruct asmJsReturn = { 0 };
        InterpreterHelper(function, args, returnAddress, addressOfReturnAddress, &asmJsReturn);

        return asmJsReturn.GetRetVal<T>();
    }